

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_SUNMemory.cpp
# Opt level: O2

void amrex::sundials::MemoryHelper::Initialize(int nthreads)

{
  undefined4 *puVar1;
  undefined8 *puVar2;
  MemoryHelper *this;
  Context *sunctx;
  undefined4 *puVar3;
  undefined8 *puVar4;
  ulong uVar5;
  ulong uVar6;
  
  if (DAT_007d8308 == (anonymous_namespace)::initialized) {
    std::vector<int,_std::allocator<int>_>::resize
              ((vector<int,_std::allocator<int>_> *)&(anonymous_namespace)::initialized,
               (long)nthreads);
    puVar1 = DAT_007d8308;
    for (puVar3 = (anonymous_namespace)::initialized; puVar3 != puVar1; puVar3 = puVar3 + 1) {
      *puVar3 = 0;
    }
    std::vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>::
    resize((vector<amrex::sundials::MemoryHelper_*,_std::allocator<amrex::sundials::MemoryHelper_*>_>
            *)&(anonymous_namespace)::the_sunmemory_helper,(long)nthreads);
    puVar2 = DAT_007d8320;
    for (puVar4 = (anonymous_namespace)::the_sunmemory_helper; puVar4 != puVar2; puVar4 = puVar4 + 1
        ) {
      *puVar4 = 0;
    }
  }
  uVar6 = 0;
  uVar5 = (ulong)(uint)nthreads;
  if (nthreads < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    if ((anonymous_namespace)::initialized[uVar6] == 0) {
      (anonymous_namespace)::initialized[uVar6] = 1;
      this = (MemoryHelper *)operator_new(0x10);
      sunctx = The_Sundials_Context((int)uVar6);
      MemoryHelper(this,sunctx);
      (anonymous_namespace)::the_sunmemory_helper[uVar6] = this;
    }
  }
  return;
}

Assistant:

void MemoryHelper::Initialize(int nthreads)
{
    if (initialized.size() == 0) {
        initialized.resize(nthreads);
        std::fill(initialized.begin(), initialized.end(), 0);
        the_sunmemory_helper.resize(nthreads);
        std::fill(the_sunmemory_helper.begin(), the_sunmemory_helper.end(), nullptr);
    }
    for (int i = 0; i < nthreads; i++) {
        if (initialized[i]) continue;
        initialized[i] = 1;
        BL_ASSERT(the_sunmemory_helper[i] == nullptr);
        the_sunmemory_helper[i] = new MemoryHelper(The_Sundials_Context(i));
    }
}